

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::detail::ContextState::finalizeTestCaseData(ContextState *this)

{
  int *piVar1;
  uint *puVar2;
  double dVar3;
  int iVar4;
  TestCase *pTVar5;
  int result_1;
  long lVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int result;
  int iVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  timeval t;
  timeval local_28;
  
  iVar10 = 0;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  lVar6 = (local_28.tv_sec * 1000000 + local_28.tv_usec) - (this->timer).m_ticks;
  auVar11._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar11._0_8_ = lVar6;
  auVar11._12_4_ = 0x45300000;
  (this->super_CurrentTestCaseStats).seconds =
       ((auVar11._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 1000000.0;
  lVar6 = 0;
  do {
    iVar10 = iVar10 + *(int *)((this->numAssertsCurrentTest_atomic).m_atomics[0].padding +
                              lVar6 + -4);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  piVar1 = &(this->super_TestRunStats).numAsserts;
  *piVar1 = *piVar1 + iVar10;
  iVar10 = 0;
  lVar6 = 0;
  do {
    iVar10 = iVar10 + *(int *)((this->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                              lVar6 + -4);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  piVar1 = &(this->super_TestRunStats).numAssertsFailed;
  *piVar1 = *piVar1 + iVar10;
  iVar10 = 0;
  lVar6 = 0;
  do {
    iVar10 = iVar10 + *(int *)((this->numAssertsCurrentTest_atomic).m_atomics[0].padding +
                              lVar6 + -4);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  (this->super_CurrentTestCaseStats).numAssertsCurrentTest = iVar10;
  iVar10 = 0;
  lVar6 = 0;
  do {
    iVar10 = iVar10 + *(int *)((this->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                              lVar6 + -4);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  (this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = iVar10;
  if (iVar10 != 0) {
    piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  pTVar5 = (this->super_ContextOptions).currentTest;
  dVar3 = (pTVar5->super_TestCaseData).m_timeout;
  dVar12 = ABS(dVar3);
  dVar14 = dVar12;
  if (dVar12 <= 0.0) {
    dVar14 = 0.0;
  }
  if (((dVar14 + 1.0) * 2.220446049250313e-16 <= ABS(0.0 - dVar3)) &&
     (dVar14 = (this->super_CurrentTestCaseStats).seconds, dVar3 < dVar14)) {
    dVar13 = ABS(dVar14);
    if (ABS(dVar14) <= dVar12) {
      dVar13 = dVar12;
    }
    if ((dVar13 + 1.0) * 2.220446049250313e-16 <= ABS(dVar3 - dVar14)) {
      piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
      *(byte *)piVar1 = (byte)*piVar1 | 0x10;
    }
  }
  uVar8 = (this->super_CurrentTestCaseStats).failure_flags;
  if ((pTVar5->super_TestCaseData).m_should_fail == true) {
    uVar9 = 0x40;
    if (uVar8 == 0) {
      (this->super_CurrentTestCaseStats).failure_flags = 0x20;
      uVar8 = 0x20;
      goto LAB_0011c618;
    }
LAB_0011c5ff:
    uVar8 = uVar8 | uVar9;
    (this->super_CurrentTestCaseStats).failure_flags = uVar8;
  }
  else {
    if ((uVar8 != 0) && (uVar9 = 0x200, (pTVar5->super_TestCaseData).m_may_fail != false))
    goto LAB_0011c5ff;
    iVar4 = (pTVar5->super_TestCaseData).m_expected_failures;
    if (0 < iVar4) {
      uVar9 = (uint)(iVar10 == iVar4) * 0x80 + 0x80;
      goto LAB_0011c5ff;
    }
  }
  if ((uVar8 & 0x240) != 0) {
    (this->super_CurrentTestCaseStats).testCaseSuccess = true;
    return;
  }
LAB_0011c618:
  bVar7 = (bool)(uVar8 == 0 | (byte)(uVar8 >> 8) & 1);
  (this->super_CurrentTestCaseStats).testCaseSuccess = bVar7;
  if (bVar7 == false) {
    puVar2 = &(this->super_TestRunStats).numTestCasesFailed;
    *puVar2 = *puVar2 + 1;
  }
  return;
}

Assistant:

void finalizeTestCaseData() {
            seconds = timer.getElapsedSeconds();

            // update the non-atomic counters
            numAsserts += numAssertsCurrentTest_atomic;
            numAssertsFailed += numAssertsFailedCurrentTest_atomic;
            numAssertsCurrentTest       = numAssertsCurrentTest_atomic;
            numAssertsFailedCurrentTest = numAssertsFailedCurrentTest_atomic;

            if(numAssertsFailedCurrentTest)
                failure_flags |= TestCaseFailureReason::AssertFailure;

            if(Approx(currentTest->m_timeout).epsilon(DBL_EPSILON) != 0 &&
               Approx(seconds).epsilon(DBL_EPSILON) > currentTest->m_timeout)
                failure_flags |= TestCaseFailureReason::Timeout;

            if(currentTest->m_should_fail) {
                if(failure_flags) {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedAndDid;
                } else {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedButDidnt;
                }
            } else if(failure_flags && currentTest->m_may_fail) {
                failure_flags |= TestCaseFailureReason::CouldHaveFailedAndDid;
            } else if(currentTest->m_expected_failures > 0) {
                if(numAssertsFailedCurrentTest == currentTest->m_expected_failures) {
                    failure_flags |= TestCaseFailureReason::FailedExactlyNumTimes;
                } else {
                    failure_flags |= TestCaseFailureReason::DidntFailExactlyNumTimes;
                }
            }

            bool ok_to_fail = (TestCaseFailureReason::ShouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::CouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::FailedExactlyNumTimes & failure_flags);

            // if any subcase has failed - the whole test case has failed
            testCaseSuccess = !(failure_flags && !ok_to_fail);
            if(!testCaseSuccess)
                numTestCasesFailed++;
        }